

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicString.h
# Opt level: O0

ulint __thiscall
bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>::numberOfBits
          (DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_> *this)

{
  byte *in_RDI;
  uint i;
  ulint tot;
  long local_70;
  bitvector_t<4096UL,_(bv::allocation_policy_t)0> *in_stack_ffffffffffffffb0;
  uint local_1c;
  ulint local_18;
  ulint local_8;
  
  if ((in_RDI[0x80] & 1) == 0) {
    local_18 = 0;
    for (local_1c = 0; local_1c < *in_RDI; local_1c = local_1c + 1) {
      std::
      vector<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>,_std::allocator<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>
      ::operator[]((vector<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>,_std::allocator<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>
                    *)(in_RDI + 0x38),(ulong)local_1c);
      bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>::info(in_stack_ffffffffffffffb0);
      local_18 = local_70 + local_18;
    }
    local_8 = local_18;
  }
  else {
    local_8 = *(ulint *)(in_RDI + 0x78);
  }
  return local_8;
}

Assistant:

ulint numberOfBits(){//sum of the lengths of the bitvectors

		if(unary_string)
			return n;

		ulint tot=0;

		for(uint i=0;i<number_of_internal_nodes;i++)
			//tot += wavelet_tree[i].maxSize();
			tot += wavelet_tree[i].info().capacity;

		return tot;

	}